

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O3

int ndn_key_storage_set_self_identity(ndn_data_t *self_cert,ndn_ecc_prv_t *self_prv_key)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ndn_data_t *pnVar6;
  long lVar7;
  ndn_key_storage_t *name;
  
  if (!_key_storage_initialized) {
    _ndn_key_storage_init();
  }
  pnVar6 = storage.self_cert;
  lVar7 = -0x84;
  name = &storage;
  do {
    if (*(int *)(storage.self_cert[0].name.components[0].value + lVar7 + 0x20) == -1) {
      memcpy(pnVar6,self_cert,0x890);
      uVar1 = *(undefined8 *)(self_prv_key->abs_key).key_value;
      uVar2 = *(undefined8 *)((self_prv_key->abs_key).key_value + 8);
      uVar3 = *(undefined8 *)((self_prv_key->abs_key).key_value + 0x10);
      uVar4 = *(undefined8 *)((self_prv_key->abs_key).key_value + 0x18);
      uVar5 = *(undefined8 *)&self_prv_key->key_id;
      *(undefined8 *)(storage.self_cert[0].name.components[0].value + lVar7 + 0x18) =
           *(undefined8 *)((self_prv_key->abs_key).key_value + 0x1c);
      *(undefined8 *)(storage.self_cert[0].name.components[0].value + lVar7 + 0x20) = uVar5;
      *(undefined8 *)(storage.self_cert[0].name.components[0].value + lVar7 + 0xc) = uVar3;
      *(undefined8 *)(storage.self_cert[0].name.components[0].value + lVar7 + 0x14) = uVar4;
      *(undefined8 *)(storage.self_cert[0].name.components[0].value + lVar7 + -4) = uVar1;
      *(undefined8 *)(storage.self_cert[0].name.components[0].value + lVar7 + 4) = uVar2;
      if (4 < (self_cert->name).components_size) {
        lVar7 = 0;
        pnVar6 = self_cert;
        do {
          ndn_name_append_component(name->self_identity,(name_component_t *)pnVar6);
          lVar7 = lVar7 + 1;
          pnVar6 = (ndn_data_t *)((pnVar6->name).components + 1);
        } while (lVar7 < (long)((ulong)(self_cert->name).components_size - 4));
      }
      ndn_name_print(name->self_identity);
      return 0;
    }
    pnVar6 = pnVar6 + 1;
    name = (ndn_key_storage_t *)(name->self_identity + 1);
    lVar7 = lVar7 + 0x2c;
  } while (lVar7 != 0);
  return -10;
}

Assistant:

int
ndn_key_storage_set_self_identity(const ndn_data_t* self_cert, const ndn_ecc_prv_t* self_prv_key)
{
  if (!_key_storage_initialized)
    _ndn_key_storage_init();
  for (int i = 0; i < NDN_SEC_CERT_SIZE; i++) {
    if (storage.self_identity_key[i].key_id == NDN_SEC_INVALID_KEY_ID) {
      memcpy(&storage.self_cert[i], self_cert, sizeof(ndn_data_t));
      memcpy(&storage.self_identity_key[i], self_prv_key, sizeof(ndn_ecc_prv_t));
      for (int j = 0; j < self_cert->name.components_size - 4; j++) {
        ndn_name_append_component(&storage.self_identity[i], &self_cert->name.components[j]);
      }
      ndn_name_print(&storage.self_identity[i]);
      return NDN_SUCCESS;
    }
  }
  return NDN_OVERSIZE;
}